

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univ_map_oa.hpp
# Opt level: O0

Am_Marshall_Method __thiscall
OpenAmulet::Map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>_>::GetAt
          (Map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>_> *this,
          unsigned_short *aKey)

{
  Am_Marshall_Method AVar1;
  bool bVar2;
  reference ppVar3;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  unsigned_short *aKey_local;
  Map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>_> *this_local;
  Am_Marshall_Method_Type *local_10;
  
  it._M_node = (_Base_ptr)aKey;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Marshall_Method>_>_>
       ::find(&this->mMap,aKey);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Marshall_Method>_>_>
       ::end(&this->mMap);
  bVar2 = std::operator!=(&local_30,&local_38);
  if (bVar2) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_short,_Am_Marshall_Method>_>::
             operator*(&local_30);
    this_local = (Map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>_> *)
                 (ppVar3->second).from_wrapper;
    local_10 = (ppVar3->second).Call;
  }
  else {
    this_local = (Map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>_> *)
                 (this->mDefaultReturn).from_wrapper;
    local_10 = (this->mDefaultReturn).Call;
  }
  AVar1.Call = local_10;
  AVar1.from_wrapper = (Am_Method_Wrapper *)this_local;
  return AVar1;
}

Assistant:

Item GetAt(const Key &aKey) const
  {
#ifdef DEBUG
    // This is for debugging propose only. If you want to look at the
    // map change the dumpMap value to true within your debugger
    bool dumpMap(false);
    if (dumpMap == true) {
      Dump();
    }
#endif

    // do we have an item with aKey?
    typename std::map<Key, Item, Compare>::const_iterator it = mMap.find(aKey);
    if (it != mMap.end()) {
      return ((*it).second);
    } else {
      // the key wasn't found so return the default object value
      return (mDefaultReturn);
    }
  }